

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIndexSnapshotEnumerator.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArrayIndexSnapshotEnumerator::JavascriptArrayIndexSnapshotEnumerator
          (JavascriptArrayIndexSnapshotEnumerator *this,JavascriptArray *arrayObject,
          EnumeratorFlags flags,ScriptContext *scriptContext)

{
  uint32 uVar1;
  ScriptContext *scriptContext_local;
  EnumeratorFlags flags_local;
  JavascriptArray *arrayObject_local;
  JavascriptArrayIndexSnapshotEnumerator *this_local;
  
  JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
            (&this->super_JavascriptArrayIndexEnumeratorBase,arrayObject,flags,scriptContext);
  (this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.super_RecyclableObject
  .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e03060;
  uVar1 = ArrayObject::GetLength(&arrayObject->super_ArrayObject);
  this->initialLength = uVar1;
  (*(this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])();
  return;
}

Assistant:

JavascriptArrayIndexSnapshotEnumerator::JavascriptArrayIndexSnapshotEnumerator(
        JavascriptArray* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext) :
        JavascriptArrayIndexEnumeratorBase(arrayObject, flags, scriptContext),
        initialLength(arrayObject->GetLength())
    {
        Reset();
    }